

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_impl.hpp
# Opt level: O2

ostringstream *
toml::detail::format_underline(ostringstream *oss,size_t lnw,size_t col,size_t len,string *msg)

{
  ostream *poVar1;
  char c;
  detail *this;
  string sStack_68;
  string local_48;
  
  c = (char)len;
  make_string_abi_cxx11_(&sStack_68,(detail *)(lnw + 1),0x20,c);
  poVar1 = std::operator<<((ostream *)oss,(string *)&sStack_68);
  poVar1 = color::ansi::bold(poVar1);
  poVar1 = color::ansi::blue(poVar1);
  poVar1 = std::operator<<(poVar1," | ");
  color::ansi::reset(poVar1);
  std::__cxx11::string::~string((string *)&sStack_68);
  this = (detail *)0x0;
  if (col != 0) {
    this = (detail *)(col - 1);
  }
  make_string_abi_cxx11_(&sStack_68,this,0x20,c);
  poVar1 = std::operator<<((ostream *)oss,(string *)&sStack_68);
  poVar1 = color::ansi::bold(poVar1);
  poVar1 = color::ansi::red(poVar1);
  make_string_abi_cxx11_(&local_48,(detail *)len,0x5e,c);
  poVar1 = std::operator<<(poVar1,(string *)&local_48);
  poVar1 = std::operator<<(poVar1,"-- ");
  poVar1 = color::ansi::reset(poVar1);
  poVar1 = std::operator<<(poVar1,(string *)msg);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&sStack_68);
  return oss;
}

Assistant:

TOML11_INLINE std::ostringstream& format_underline(std::ostringstream& oss,
        const std::size_t lnw, const std::size_t col, const std::size_t len,
        const std::string& msg)
{
    //    |       ^^^^^^^-- this part
    oss << make_string(lnw + 1, ' ')
        << color::bold << color::blue << " | " << color::reset;

    // in case col is 0, so we don't create a string with size_t max length
    const std::size_t sanitized_col = col == 0 ? 0 : col - 1 /*1-origin*/;
    oss << make_string(sanitized_col, ' ')
        << color::bold << color::red
        << make_string(len, '^') << "-- "
        << color::reset << msg << '\n';

    return oss;
}